

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportFragments.c
# Opt level: O0

void sbfTport_fragment(sbfTportStream tstream,sbfBuffer buffer,sbfTportHeader hdr,size_t hdrSize)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  size_t size_00;
  sbfBuffer buffer_00;
  ulong in_RCX;
  void *in_RDX;
  sbfBuffer in_RSI;
  long *in_RDI;
  sbfTportHeader fraghdr;
  size_t fragsize;
  sbfBuffer fragbuffer;
  uint8_t fragnum;
  size_t offset;
  size_t size;
  void *data;
  sbfTport tport;
  sbfTportStream in_stack_ffffffffffffffa0;
  char local_41;
  ulong local_40;
  
  lVar1 = *in_RDI;
  if (in_RCX <= **(ushort **)(lVar1 + 0x20)) {
    pvVar2 = sbfBuffer_getData(in_RSI);
    sVar3 = sbfBuffer_getSize(in_RSI);
    local_41 = '\x01';
    pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 5));
    local_40 = 0;
    while (local_40 < sVar3) {
      if (sVar3 - local_40 < **(ushort **)(lVar1 + 0x20) - in_RCX) {
        size_00 = sVar3 - local_40;
      }
      else {
        size_00 = **(ushort **)(lVar1 + 0x20) - in_RCX;
      }
      buffer_00 = sbfTport_getBuffer(in_stack_ffffffffffffffa0,size_00);
      in_stack_ffffffffffffffa0 = (sbfTportStream)sbfBuffer_getData(buffer_00);
      memcpy(in_stack_ffffffffffffffa0,in_RDX,in_RCX);
      *(short *)&in_stack_ffffffffffffffa0->mTport = (short)size_00;
      *(undefined1 *)((long)&in_stack_ffffffffffffffa0->mTport + 4) = 1;
      *(char *)((long)&in_stack_ffffffffffffffa0->mTport + 2) = local_41;
      memcpy((void *)((long)&in_stack_ffffffffffffffa0->mTport + in_RCX),
             (void *)((long)pvVar2 + local_40),size_00);
      local_40 = size_00 + local_40;
      if (local_40 == sVar3) {
        *(byte *)((long)&in_stack_ffffffffffffffa0->mTport + 4) =
             *(byte *)((long)&in_stack_ffffffffffffffa0->mTport + 4) | 2;
      }
      (**(code **)(*(long *)(lVar1 + 0x20) + 0x38))(in_RDI[2],buffer_00);
      local_41 = local_41 + '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 5));
    return;
  }
  __assert_fail("tport->mHandlerTable->mPacketSize >= hdrSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfTportFragments.c"
                ,0x19,"void sbfTport_fragment(sbfTportStream, sbfBuffer, sbfTportHeader, size_t)");
}

Assistant:

void
sbfTport_fragment (sbfTportStream tstream,
                   sbfBuffer buffer,
                   sbfTportHeader hdr,
                   size_t hdrSize)
{
    sbfTport       tport = tstream->mTport;
    void*          data;
    size_t         size;
    size_t         offset;
    uint8_t        fragnum;
    sbfBuffer      fragbuffer;
    size_t         fragsize;
    sbfTportHeader fraghdr;

    SBF_ASSERT (tport->mHandlerTable->mPacketSize >= hdrSize);

    data = sbfBuffer_getData (buffer);
    size = sbfBuffer_getSize (buffer);

    fragnum = 1;

    sbfMutex_lock (&tstream->mSendLock);

    offset = 0;
    while (offset < size)
    {
        fragsize = SBF_MIN (tport->mHandlerTable->mPacketSize - hdrSize,
                            size - offset);
        fragbuffer = sbfTport_getBuffer (tstream, fragsize + hdrSize);

        fraghdr = sbfBuffer_getData (fragbuffer);
        memcpy (fraghdr, hdr, hdrSize);
        fraghdr->mSize = fragsize;
        fraghdr->mFlags = SBF_MESSAGE_FLAG_LAST_IN_PACKET;
        fraghdr->mFragNum = fragnum++;

        memcpy ((char*)fraghdr + hdrSize, (char*)data + offset, fragsize);

        offset += fragsize;
        if (offset == size)
            fraghdr->mFlags |= SBF_MESSAGE_FLAG_LAST_FRAGMENT;

        tport->mHandlerTable->mSendBuffer (tstream->mStream, fragbuffer);
    }

    sbfMutex_unlock (&tstream->mSendLock);
}